

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.cpp
# Opt level: O0

void initSearchTree(int *array,int length,Tree<int> *tree)

{
  bool bVar1;
  int iVar2;
  Node<int> *pNVar3;
  undefined4 extraout_var;
  int *piVar4;
  int local_48;
  int i;
  bool isLeft;
  Node<int> *parent;
  long *local_28;
  Node<int> *node;
  Tree<int> *tree_local;
  int length_local;
  int *array_local;
  
  if (length == 0) {
    (*tree->_vptr_Tree[9])(tree,0);
  }
  else {
    pNVar3 = (Node<int> *)operator_new(0x30);
    Node<int>::Node(pNVar3,array);
    _i = (long *)0x0;
    bVar1 = true;
    (*tree->_vptr_Tree[9])(tree,pNVar3);
    for (local_48 = 1; local_48 < length; local_48 = local_48 + 1) {
      iVar2 = (*tree->_vptr_Tree[8])();
      local_28 = (long *)CONCAT44(extraout_var,iVar2);
      while (local_28 != (long *)0x0) {
        _i = local_28;
        iVar2 = array[local_48];
        piVar4 = (int *)(**(code **)(*local_28 + 0x20))();
        if (*piVar4 < iVar2) {
          iVar2 = array[local_48];
          piVar4 = (int *)(**(code **)(*local_28 + 0x20))();
          if (*piVar4 < iVar2) {
            local_28 = (long *)(**(code **)(*local_28 + 0x40))();
            bVar1 = false;
          }
        }
        else {
          local_28 = (long *)(**(code **)*local_28)();
          bVar1 = true;
        }
      }
      pNVar3 = (Node<int> *)operator_new(0x30);
      Node<int>::Node(pNVar3,array + local_48);
      if (bVar1) {
        (**(code **)(*_i + 8))(_i,pNVar3);
      }
      else {
        (**(code **)(*_i + 0x48))(_i,pNVar3);
      }
    }
  }
  return;
}

Assistant:

void initSearchTree(int* array, int length, Tree<int>& tree){
    if (length == 0){
        tree.setRoot(nullptr);
        return;
    }
    Node<int>* node = new Node<int>(array[0]);
    Node<int>* parent = nullptr;
    bool isLeft = true;
    tree.setRoot(node);
    for (int i = 1; i < length; ++i) {
        node = tree.getRoot();
        while (node){
            parent = node;
            if (array[i] <= node->getDataNode()){
                node = node->getLeftPoint();
                isLeft = true;
            } else if (array[i] > node->getDataNode()){
                    node = node->getRightPoint();
                    isLeft = false;
            }
        }
        node = new Node<int>(array[i]);
        if (isLeft){
            parent->setLeftPoint(node);
        } else {
            parent->setRightPoint(node);
        }
    }
}